

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O3

bool ft::operator==(map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *lhs,
                   map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *rhs)

{
  bool bVar1;
  undefined **local_50;
  rbtree *local_48;
  treeNode<ft::pair<const_int,_int>_> *local_40;
  undefined **local_38;
  rbtree *local_30;
  treeNode<ft::pair<const_int,_int>_> *local_28;
  undefined **local_20;
  rbtree *local_18;
  treeNode<ft::pair<const_int,_int>_> *local_10;
  
  if ((lhs->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      .m_size ==
      (rhs->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      .m_size) {
    local_48 = &(lhs->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_tree;
    local_28 = (lhs->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree.m_last;
    local_40 = ((lhs->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_tree.m_first)->parent;
    local_18 = &(rhs->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_tree;
    local_10 = ((rhs->
                super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
                super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                .m_tree.m_first)->parent;
    local_50 = &PTR__treeIterator_00113d00;
    local_38 = &PTR__treeIterator_00113d00;
    local_20 = &PTR__treeIterator_00113d00;
    local_30 = local_48;
    bVar1 = equal<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::equal_to<ft::pair<int_const,int>>>
                      (&local_50,&local_38,&local_20,0,0);
    return bVar1;
  }
  return false;
}

Assistant:

size_type	size() const { return this->m_size; }